

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O0

int ncnn::get_little_cpu_count(void)

{
  int iVar1;
  undefined8 in_RAX;
  CpuSet *unaff_retaddr;
  
  get_cpu_thread_affinity_mask((int)((ulong)in_RAX >> 0x20));
  iVar1 = CpuSet::num_enabled(unaff_retaddr);
  return iVar1;
}

Assistant:

int get_little_cpu_count()
{
    return get_cpu_thread_affinity_mask(1).num_enabled();
}